

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void acttab_action(acttab *p,int lookahead,int action)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  lookahead_action *plVar9;
  long lVar10;
  lookahead_action lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  lookahead_action *plVar16;
  lookahead_action lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  
  iVar6 = p->nLookaheadAlloc;
  if (iVar6 <= p->nLookahead) {
    p->nLookaheadAlloc = iVar6 + 0x19;
    plVar16 = p->aLookahead;
    plVar9 = (lookahead_action *)realloc(plVar16,(long)iVar6 * 8 + 200);
    p->aLookahead = plVar9;
    if (plVar9 == (lookahead_action *)0x0) {
      acttab_action_cold_1();
      if (plVar16[4].action < 1) {
        __assert_fail("p->nLookahead>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                      ,0x229,"int acttab_insert(acttab *)");
      }
      iVar6 = plVar16->lookahead + plVar16[4].lookahead + 1;
      uVar1 = plVar16->action;
      if ((int)uVar1 <= iVar6) {
        iVar6 = iVar6 + uVar1 + 0x14;
        plVar16->action = iVar6;
        lVar17 = plVar16[1];
        lVar11 = (lookahead_action)realloc((void *)lVar17,(long)iVar6 << 3);
        plVar16[1] = lVar11;
        if (lVar11 == (lookahead_action)0x0) {
          acttab_insert_cold_1();
          lVar10 = *(long *)((long)lVar17 + 8);
          do {
            if (lVar10 == 0) {
              return;
            }
            if ((*(long *)(lVar10 + 0x50) == 0) && (0 < (long)*(int *)(lVar10 + 0x18))) {
              lVar14 = *(long *)(lVar10 + 0x50);
              lVar13 = 0;
              do {
                if (lVar14 != 0) break;
                lVar3 = *(long *)(*(long *)(lVar10 + 0x20) + lVar13 * 8);
                if (*(int *)(lVar3 + 0xc) == 2) {
                  if (0 < (long)*(int *)(lVar3 + 0x54)) {
                    lVar20 = 0;
                    do {
                      lVar4 = *(long *)(*(long *)(lVar3 + 0x58) + lVar20 * 8);
                      if (-1 < *(int *)(lVar4 + 0x20)) goto LAB_00103df8;
                      lVar20 = lVar20 + 1;
                    } while (*(int *)(lVar3 + 0x54) != lVar20);
                  }
                }
                else {
                  lVar4 = lVar3;
                  if (-1 < *(int *)(lVar3 + 0x20)) {
LAB_00103df8:
                    lVar14 = lVar4;
                    *(long *)(lVar10 + 0x50) = lVar14;
                  }
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != *(int *)(lVar10 + 0x18));
            }
            lVar10 = *(long *)(lVar10 + 0x70);
          } while( true );
        }
        if ((int)uVar1 < plVar16->action) {
          memset((void *)((long)lVar11 + (long)(int)uVar1 * 8),0xff,
                 (ulong)(plVar16->action + ~uVar1) * 8 + 8);
        }
      }
      uVar1 = plVar16->lookahead;
      uVar7 = uVar1 - 1;
      if ((int)uVar1 < 1) {
        bVar5 = true;
      }
      else {
        lVar17 = plVar16[1];
        iVar6 = plVar16[3].lookahead;
        iVar18 = iVar6 - uVar1;
        uVar19 = (ulong)uVar1;
        uVar12 = (ulong)uVar7;
        do {
          iVar18 = iVar18 + 1;
          iVar15 = (int)uVar19;
          if ((*(int *)((long)lVar17 + uVar12 * 8) == iVar6) &&
             (*(int *)((long)lVar17 + 4 + uVar12 * 8) == plVar16[3].action)) {
            uVar19 = (ulong)plVar16[4].action;
            bVar5 = 0 < (long)uVar19;
            if (0 < (long)uVar19) {
              lVar11 = plVar16[2];
              iVar21 = *(int *)lVar11;
              uVar7 = (iVar21 - iVar6) + (int)uVar12;
              if (uVar7 < uVar1) {
                uVar22 = 1;
                do {
                  if ((iVar21 != *(int *)((long)lVar17 + (ulong)uVar7 * 8)) ||
                     (((int *)((long)lVar11 + -4))[uVar22 * 2] !=
                      *(int *)((long)lVar17 + 4 + (ulong)uVar7 * 8))) break;
                  if (uVar19 == uVar22) goto LAB_00103c17;
                  bVar5 = uVar22 < uVar19;
                  iVar21 = *(int *)((long)lVar11 + uVar22 * 8);
                  uVar7 = (iVar21 - iVar6) + (int)uVar12;
                  uVar22 = uVar22 + 1;
                } while (uVar7 < uVar1);
              }
              if (bVar5) goto LAB_00103c49;
            }
LAB_00103c17:
            uVar19 = 0;
            iVar21 = 0;
            do {
              iVar2 = *(int *)((long)lVar17 + uVar19 * 8);
              iVar21 = iVar21 + (uint)(iVar18 + (int)uVar19 == iVar2 && -1 < iVar2);
              uVar19 = uVar19 + 1;
            } while (uVar1 != uVar19);
            if (iVar21 == plVar16[4].action) goto LAB_00103c65;
          }
LAB_00103c49:
          uVar19 = uVar12 & 0xffffffff;
          bVar5 = 0 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar5);
        uVar12 = 0xffffffff;
        iVar15 = 0;
LAB_00103c65:
        uVar7 = (uint)uVar12;
        bVar5 = iVar15 < 1;
      }
      if (bVar5) {
        uVar8 = plVar16->action - plVar16[4].lookahead;
        if (uVar8 == 0 || plVar16->action < plVar16[4].lookahead) {
          uVar7 = 0;
        }
        else {
          lVar17 = plVar16[1];
          iVar6 = 0;
          uVar12 = 0;
          do {
            if (*(int *)((long)lVar17 + uVar12 * 8) < 0) {
              uVar19 = (ulong)plVar16[4].action;
              bVar5 = 0 < (long)uVar19;
              uVar7 = (uint)uVar12;
              if (0 < (long)uVar19) {
                uVar23 = (*(int *)plVar16[2] - plVar16[3].lookahead) + uVar7;
                if (-1 < (int)uVar23) {
                  uVar22 = 1;
                  do {
                    if (-1 < *(int *)((long)lVar17 + (ulong)uVar23 * 8)) break;
                    if (uVar19 == uVar22) goto LAB_00103ce1;
                    bVar5 = uVar22 < uVar19;
                    lVar10 = uVar22 * 8;
                    uVar22 = uVar22 + 1;
                    uVar23 = (*(int *)((long)plVar16[2] + lVar10) - plVar16[3].lookahead) + uVar7;
                  } while (-1 < (int)uVar23);
                }
                if (bVar5) goto LAB_00103d0e;
              }
LAB_00103ce1:
              if ((int)uVar1 < 1) {
                uVar19 = 0;
              }
              else {
                uVar19 = 0;
                do {
                  if (plVar16[3].lookahead + iVar6 + (int)uVar19 ==
                      *(int *)((long)lVar17 + uVar19 * 8)) goto LAB_00103d09;
                  uVar19 = uVar19 + 1;
                } while (uVar1 != uVar19);
                uVar19 = (ulong)uVar1;
              }
LAB_00103d09:
              if ((uint)uVar19 == uVar1) break;
            }
LAB_00103d0e:
            uVar12 = uVar12 + 1;
            iVar6 = iVar6 + -1;
            uVar7 = uVar8;
          } while (uVar12 != uVar8);
        }
      }
      if (0 < plVar16[4].action) {
        lVar10 = 0;
        do {
          iVar6 = (*(int *)((long)plVar16[2] + lVar10 * 8) - plVar16[3].lookahead) + uVar7;
          *(undefined8 *)((long)plVar16[1] + (long)iVar6 * 8) =
               *(undefined8 *)((long)plVar16[2] + lVar10 * 8);
          if (plVar16->lookahead <= iVar6) {
            plVar16->lookahead = iVar6 + 1;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < plVar16[4].action);
      }
      plVar16[4].action = 0;
      return;
    }
  }
  iVar6 = p->nLookahead;
  lVar10 = (long)iVar6;
  if (lVar10 == 0) {
    p->mxLookahead = lookahead;
  }
  else {
    if (p->mxLookahead < lookahead) {
      p->mxLookahead = lookahead;
    }
    if (p->mnLookahead <= lookahead) goto LAB_00103af2;
  }
  p->mnLookahead = lookahead;
  p->mnAction = action;
LAB_00103af2:
  plVar16 = p->aLookahead;
  plVar16[lVar10].lookahead = lookahead;
  plVar16[lVar10].action = action;
  p->nLookahead = iVar6 + 1;
  return;
}

Assistant:

void acttab_action(acttab *p, int lookahead, int action){
  if( p->nLookahead>=p->nLookaheadAlloc ){
    p->nLookaheadAlloc += 25;
    p->aLookahead = (struct lookahead_action *) realloc( p->aLookahead,
                             sizeof(p->aLookahead[0])*p->nLookaheadAlloc );
    if( p->aLookahead==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
  }
  if( p->nLookahead==0 ){
    p->mxLookahead = lookahead;
    p->mnLookahead = lookahead;
    p->mnAction = action;
  }else{
    if( p->mxLookahead<lookahead ) p->mxLookahead = lookahead;
    if( p->mnLookahead>lookahead ){
      p->mnLookahead = lookahead;
      p->mnAction = action;
    }
  }
  p->aLookahead[p->nLookahead].lookahead = lookahead;
  p->aLookahead[p->nLookahead].action = action;
  p->nLookahead++;
}